

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O1

void kratos::add_generator_static_value(Module *m,string *name,string *value)

{
  size_type *psVar1;
  size_type *psVar2;
  pointer pcVar3;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined8 local_a0;
  _Storage<unsigned_long,_true> _Stack_98;
  undefined8 local_90;
  size_type *local_88;
  Variable v;
  
  psVar1 = &v.name._M_string_length;
  pcVar3 = (name->_M_dataplus)._M_p;
  local_88 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + name->_M_string_length);
  psVar2 = &v.value._M_string_length;
  pcVar3 = (value->_M_dataplus)._M_p;
  v.name.field_2._8_8_ = psVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&v.name.field_2 + 8),pcVar3,pcVar3 + value->_M_string_length);
  v.value.field_2._M_local_buf[8] = '\0';
  v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  local_e0._0_8_ = local_e0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,local_88,v.name._M_dataplus._M_p + (long)local_88);
  local_c0._M_p = (pointer)&local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,v.name.field_2._8_8_,
             v.value._M_dataplus._M_p + v.name.field_2._8_8_);
  local_90._1_7_ =
       v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload._M_value._1_7_;
  local_90._0_1_ =
       (bool)v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_;
  local_a0._1_7_ = v.value.field_2._9_7_;
  local_a0._0_1_ = (bool)v.value.field_2._M_local_buf[8];
  _Stack_98 = (_Storage<unsigned_long,_true>)v._64_8_;
  std::
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ::emplace_back<hgdb::json::Variable>(&m->variables_,(Variable *)local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != &local_b0) {
    operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
  }
  if ((size_type *)v.name.field_2._8_8_ != psVar2) {
    operator_delete((void *)v.name.field_2._8_8_,v.value._M_string_length + 1);
  }
  if (local_88 != psVar1) {
    operator_delete(local_88,v.name._M_string_length + 1);
  }
  return;
}

Assistant:

void add_generator_static_value(hgdb::json::Module &m, const std::string &name,
                                const std::string &value) {
    hgdb::json::Variable v{.name = name, .value = value, .rtl = false, .id = std::nullopt};
    m.add_variable(v);
}